

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

void jessilib::impl_join::
     join_mb_append<std::basic_string_view<char32_t,std::char_traits<char32_t>>&>
               (string *out_string,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> *in_string)

{
  char32_t *in_RCX;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string_00;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_38;
  
  in_string_00._M_str = in_RCX;
  in_string_00._M_len = (size_t)in_string->_M_str;
  ustring_to_mbstring<char32_t>(&pStack_38,(jessilib *)in_string->_M_len,in_string_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (out_string,pStack_38.second._M_dataplus._M_p,pStack_38.second._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_38.second._M_dataplus._M_p != &pStack_38.second.field_2) {
    operator_delete(pStack_38.second._M_dataplus._M_p,
                    pStack_38.second.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void join_mb_append(std::string& out_string, InT&& in_string, ArgsT&&... in_args) {
	// TODO: is this a valid approach? is mbstate fine it discard between appends?
	if constexpr (std::is_same_v<char32_t, InT>) {
		out_string += ustring_to_mbstring(std::u32string_view{ &in_string, 1 }).second;
	}
	else {
		out_string += ustring_to_mbstring(in_string).second;
	}

	join_mb_append(out_string, std::forward<ArgsT>(in_args)...);
}